

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorAction.cpp
# Opt level: O3

void __thiscall QColorActionPrivate::~QColorActionPrivate(QColorActionPrivate *this)

{
  *(undefined ***)this = &PTR_metaObject_001aa610;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->caption).d);
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x48);
  return;
}

Assistant:

class QColorActionPrivate : public QObject {
    Q_OBJECT

public:
    explicit QColorActionPrivate(QColorAction *actionP)
        : QObject(actionP)
        , action(actionP)
        , options() {
        Q_ASSERT(action);

        connect(action, &QAction::triggered, this, &QColorActionPrivate::triggered);
    }

    void triggered() {
        const QColor newColor =
            QColorDialog::getColor(color, nullptr, caption, QColorDialog::ColorDialogOptions(int(options)));

        if (newColor.isValid()) {
            action->setColor(newColor);
        }
    }